

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O3

Promise<void> __thiscall
capnp::_::TestInterfaceImpl::baz(TestInterfaceImpl *this,BazContext context)

{
  int iVar1;
  long *in_RDX;
  bool bVar2;
  Reader params;
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition;
  SegmentReader *local_778;
  CapTableReader *pCStackY_770;
  WirePointer *local_768;
  int iStackY_760;
  undefined4 uStackY_75c;
  StructReader local_758;
  PointerReader local_728;
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> local_708;
  StructReader local_548;
  StructReader local_518;
  Maybe<kj::Exception> local_4e8;
  Maybe<kj::Exception> local_350;
  StructReader in_stack_fffffffffffffed0;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  (**(code **)*in_RDX)(&local_350);
  local_708.left.ptr.field_1.value.ownFile.content.size_ =
       local_350.ptr.field_1.value.ownFile.content.size_;
  local_708.left.ptr.field_1.value.ownFile.content.disposer =
       local_350.ptr.field_1.value.ownFile.content.disposer;
  local_708.left.ptr.field_1.value.ownFile.content.ptr =
       local_350.ptr.field_1.value.ownFile.content.ptr;
  PointerReader::getStruct(&local_758,(PointerReader *)&local_708,(word *)0x0);
  bVar2 = local_758.pointerCount == 0;
  local_708.left.ptr.field_1.value.ownFile.content.size_ = (size_t)local_758.pointers;
  if (bVar2) {
    local_708.left.ptr.field_1.value.ownFile.content.size_ = (size_t)(WirePointer *)0x0;
  }
  iVar1 = 0x7fffffff;
  if (!bVar2) {
    iVar1 = local_758.nestingLimit;
  }
  local_708.left.ptr._0_4_ = 0;
  local_708.left.ptr._4_4_ = 0;
  local_708.left.ptr.field_1._0_4_ = 0;
  local_708.left.ptr.field_1._4_4_ = 0;
  if (!bVar2) {
    local_708.left.ptr._0_4_ = local_758.segment._0_4_;
    local_708.left.ptr._4_4_ = local_758.segment._4_4_;
    local_708.left.ptr.field_1._0_4_ = local_758.capTable._0_4_;
    local_708.left.ptr.field_1._4_4_ = local_758.capTable._4_4_;
  }
  local_708.left.ptr.field_1._16_4_ = iVar1;
  PointerReader::getStruct(&local_548,(PointerReader *)&local_708,(word *)0x0);
  anon_unknown_133::genericCheckTestMessage<capnproto_test::capnp::test::TestAllTypes::Reader>
            ((Reader)in_stack_fffffffffffffed0);
  (**(code **)(*in_RDX + 8))();
  (**(code **)*in_RDX)(&local_778);
  local_728.pointer = local_768;
  local_728.nestingLimit = iStackY_760;
  local_728._28_4_ = uStackY_75c;
  local_728.segment = local_778;
  local_728.capTable = pCStackY_770;
  PointerReader::getStruct(&local_518,&local_728,(word *)0x0);
  local_4e8.ptr.isSet = false;
  kj::Maybe<kj::Exception>::Maybe(&local_350,&local_4e8);
  bVar2 = local_350.ptr.isSet;
  kj::Maybe<kj::Exception>::Maybe(&local_708.left,&local_350);
  local_708.right = (None *)&kj::none;
  local_708.op.content.ptr = " != ";
  local_708.op.content.size_ = 5;
  local_708.result = bVar2;
  if (local_350.ptr.isSet == true) {
    kj::Exception::~Exception(&local_350.ptr.field_1.value);
  }
  if (local_4e8.ptr.isSet == true) {
    kj::Exception::~Exception(&local_4e8.ptr.field_1.value);
  }
  if ((local_708.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[89],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x392,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { context.getParams(); }) != kj::none\", _kjCondition"
               ,(char (*) [89])
                "failed: expected ::kj::runCatchingExceptions([&]() { context.getParams(); }) != kj::none"
               ,&local_708);
  }
  if (local_708.left.ptr.isSet == true) {
    kj::Exception::~Exception(&local_708.left.ptr.field_1.value);
  }
  kj::_::readyNow();
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestInterfaceImpl::baz(BazContext context) {
  ++callCount;
  auto params = context.getParams();
  checkTestMessage(params.getS());
  context.releaseParams();
  EXPECT_ANY_THROW(context.getParams());

  return kj::READY_NOW;
}